

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_InitialConfigure
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,int primeBuffers,
                  snd_pcm_hw_params_t *hwParams,double *sampleRate)

{
  snd_pcm_t *pcm;
  int iVar1;
  int iVar2;
  uint uVar3;
  pthread_t pVar4;
  undefined4 in_register_00000014;
  char *pcVar5;
  uint minPeriods;
  double sr;
  double local_40;
  undefined4 local_34;
  
  pcm = self->pcm;
  sr = *(double *)CONCAT44(in_register_00000014,primeBuffers);
  minPeriods = 2;
  local_40 = sr;
  iVar1 = snd_pcm_hw_params_any(pcm);
  if (iVar1 < 0) {
    pVar4 = pthread_self();
    iVar2 = pthread_equal(pVar4,paUnixMainThread);
    if (iVar2 != 0) {
      pcVar5 = (char *)snd_strerror(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
    }
    pcVar5 = 
    "Expression \'alsa_snd_pcm_hw_params_any( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1974\n"
    ;
  }
  else {
    iVar1 = snd_pcm_hw_params_set_periods_integer(pcm,params);
    if (iVar1 < 0) {
      pVar4 = pthread_self();
      iVar2 = pthread_equal(pVar4,paUnixMainThread);
      if (iVar2 != 0) {
        pcVar5 = (char *)snd_strerror(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
      }
      pcVar5 = 
      "Expression \'alsa_snd_pcm_hw_params_set_periods_integer( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1976\n"
      ;
    }
    else {
      local_34 = 0;
      iVar1 = snd_pcm_hw_params_set_periods_min(pcm,params,&minPeriods);
      if (iVar1 < 0) {
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar5 = (char *)snd_strerror(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
        }
        pcVar5 = 
        "Expression \'alsa_snd_pcm_hw_params_set_periods_min( pcm, hwParams, &minPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 1979\n"
        ;
      }
      else {
        if (self->userInterleaved == 0) {
          iVar1 = 1;
          iVar2 = snd_pcm_hw_params_test_access(pcm,params,1);
          if (iVar2 < 0) {
            uVar3 = snd_pcm_hw_params_test_access(pcm,params,0);
            self->canMmap = ~uVar3 >> 0x1f;
            iVar2 = ((int)uVar3 >> 0x1f) * -3;
            iVar1 = ((int)uVar3 >> 0x1f) * -3 + 1;
          }
          else {
            self->canMmap = 1;
            iVar2 = 0;
          }
        }
        else {
          iVar1 = 0;
          iVar2 = snd_pcm_hw_params_test_access(pcm,params,0);
          if (iVar2 < 0) {
            uVar3 = snd_pcm_hw_params_test_access(pcm,params,1);
            self->canMmap = ~uVar3 >> 0x1f;
            iVar2 = ((int)uVar3 >> 0x1f) * -3 + 1;
            iVar1 = ((int)uVar3 >> 0x1f) * -3;
          }
          else {
            self->canMmap = 1;
            iVar2 = 1;
          }
        }
        iVar1 = snd_pcm_hw_params_set_access(pcm,params,iVar1);
        if (iVar1 < 0) {
          iVar1 = snd_pcm_hw_params_set_access(pcm,params,iVar2);
          if (iVar1 < 0) {
            pcVar5 = (char *)snd_strerror(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
            return -9999;
          }
          self->hostInterleaved = (uint)(self->userInterleaved == 0);
        }
        iVar1 = snd_pcm_hw_params_set_format(pcm,params,self->nativeFormat);
        if (-1 < iVar1) {
          iVar1 = SetApproximateSampleRate(pcm,(snd_pcm_hw_params_t *)params,local_40);
          if (iVar1 == -9999) {
            paUtilErr_ = -9999;
            pcVar5 = 
            "Expression \'paUnanticipatedHostError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2048\n"
            ;
          }
          else {
            iVar2 = GetExactSampleRate((snd_pcm_hw_params_t *)params,&sr);
            if (iVar2 < 0) {
              pVar4 = pthread_self();
              iVar1 = pthread_equal(pVar4,paUnixMainThread);
              if (iVar1 != 0) {
                pcVar5 = (char *)snd_strerror(iVar2);
                PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar2,pcVar5);
              }
              pcVar5 = 
              "Expression \'GetExactSampleRate( hwParams, &sr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2039\n"
              ;
              goto LAB_0010c119;
            }
            if (iVar1 != -0x270d) {
              iVar2 = snd_pcm_hw_params_set_channels(pcm,params,self->numHostChannels);
              if (iVar2 < 0) {
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2051\n"
                                 );
                return -0x270e;
              }
              *(double *)CONCAT44(in_register_00000014,primeBuffers) = sr;
              return iVar1;
            }
            paUtilErr_ = -0x270d;
            pcVar5 = 
            "Expression \'paInvalidSampleRate\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2043\n"
            ;
          }
          PaUtil_DebugPrint(pcVar5);
          return paUtilErr_;
        }
        pVar4 = pthread_self();
        iVar2 = pthread_equal(pVar4,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar5 = (char *)snd_strerror(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
        }
        pcVar5 = 
        "Expression \'alsa_snd_pcm_hw_params_set_format( pcm, hwParams, self->nativeFormat )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2035\n"
        ;
      }
    }
  }
LAB_0010c119:
  PaUtil_DebugPrint(pcVar5);
  return -9999;
}

Assistant:

static PaError PaAlsaStreamComponent_InitialConfigure( PaAlsaStreamComponent *self, const PaStreamParameters *params,
        int primeBuffers, snd_pcm_hw_params_t *hwParams, double *sampleRate )
{
    /* Configuration consists of setting all of ALSA's parameters.
     * These parameters come in two flavors: hardware parameters
     * and software paramters.  Hardware parameters will affect
     * the way the device is initialized, software parameters
     * affect the way ALSA interacts with me, the user-level client.
     */

    PaError result = paNoError;
    snd_pcm_access_t accessMode, alternateAccessMode;
    int dir = 0;
    snd_pcm_t *pcm = self->pcm;
    double sr = *sampleRate;
    unsigned int minPeriods = 2;

    /* self->framesPerPeriod = framesPerHostBuffer; */

    /* ... fill up the configuration space with all possibile
     * combinations of parameters this device will accept */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_hw_params_set_periods_integer( pcm, hwParams ), paUnanticipatedHostError );
    /* I think there should be at least 2 periods (even though ALSA doesn't appear to enforce this) */
    dir = 0;
    ENSURE_( alsa_snd_pcm_hw_params_set_periods_min( pcm, hwParams, &minPeriods, &dir ), paUnanticipatedHostError );

    if( self->userInterleaved )
    {
        accessMode          = SND_PCM_ACCESS_MMAP_INTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_INTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_NONINTERLEAVED;
        }
    }
    else
    {
        accessMode          = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_INTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG((" %s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_NONINTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_INTERLEAVED;
        }
    }

    PA_DEBUG(( "%s: device can MMAP: %s\n", __FUNCTION__, ( self->canMmap ? "YES" : "NO" ) ));

    /* If requested access mode fails, try alternate mode */
    if( alsa_snd_pcm_hw_params_set_access( pcm, hwParams, accessMode ) < 0 )
    {
        int err = 0;
        if( ( err = alsa_snd_pcm_hw_params_set_access( pcm, hwParams, alternateAccessMode )) < 0 )
        {
            result = paUnanticipatedHostError;
            PaUtil_SetLastHostErrorInfo( paALSA, err, alsa_snd_strerror( err ) );
            goto error;
        }
        /* Flip mode */
        self->hostInterleaved = !self->userInterleaved;
    }

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, self->nativeFormat ), paUnanticipatedHostError );

    if( ( result = SetApproximateSampleRate( pcm, hwParams, sr )) != paUnanticipatedHostError )
    {
        ENSURE_( GetExactSampleRate( hwParams, &sr ), paUnanticipatedHostError );
        if( result == paInvalidSampleRate ) /* From the SetApproximateSampleRate() call above */
        { /* The sample rate was returned as 'out of tolerance' of the one requested */
            PA_DEBUG(( "%s: Wanted %.3f, closest sample rate was %.3f\n", __FUNCTION__, sampleRate, sr ));
            PA_ENSURE( paInvalidSampleRate );
        }
    }
    else
    {
       PA_ENSURE( paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels ), paInvalidChannelCount );

    *sampleRate = sr;

end:
    return result;

error:
    /* No particular action */
    goto end;
}